

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

int slang::ast::Constraint::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  uint uVar2;
  ConstraintBlockSyntax *this;
  Constraint *pCVar3;
  LoopConstraintSyntax *syntax;
  ExpressionConstraintSyntax *syntax_00;
  UniquenessConstraintSyntax *this_00;
  ConditionalConstraintSyntax *syntax_01;
  ImplicationConstraintSyntax *syntax_02;
  DisableConstraintSyntax *syntax_03;
  SolveBeforeConstraintSyntax *syntax_04;
  logic_error *this_01;
  long *plVar4;
  size_type *psVar5;
  Info *pIVar6;
  long *plVar7;
  undefined4 in_register_00000014;
  ASTContext *context;
  ASTContext *context_00;
  undefined4 in_register_0000003c;
  SyntaxNode *this_02;
  ASTContext ctx;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  undefined1 local_108 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Info *local_b0;
  long local_a8;
  Info local_a0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_02 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  local_108._0_2_ = __addr->sa_family;
  local_108[2] = __addr->sa_data[0];
  local_108[3] = __addr->sa_data[1];
  local_108._4_4_ = *(undefined4 *)(__addr->sa_data + 2);
  local_108._8_4_ = *(undefined4 *)(__addr->sa_data + 6);
  local_108[0xc] = __addr->sa_data[10];
  local_108[0xd] = __addr->sa_data[0xb];
  local_108[0xe] = __addr->sa_data[0xc];
  local_108[0xf] = __addr->sa_data[0xd];
  uVar2._0_2_ = __addr[1].sa_family;
  uVar2._2_1_ = __addr[1].sa_data[0];
  uVar2._3_1_ = __addr[1].sa_data[1];
  local_108._20_4_ = *(undefined4 *)(__addr[1].sa_data + 2);
  local_108._24_4_ = *(undefined4 *)(__addr[1].sa_data + 6);
  local_108._28_4_ = *(undefined4 *)(__addr[1].sa_data + 10);
  local_108._32_2_ = __addr[2].sa_family;
  local_108[0x22] = __addr[2].sa_data[0];
  local_108[0x23] = __addr[2].sa_data[1];
  local_108._36_4_ = *(undefined4 *)(__addr[2].sa_data + 2);
  local_108._40_4_ = *(undefined4 *)(__addr[2].sa_data + 6);
  local_108._44_4_ = *(undefined4 *)(__addr[2].sa_data + 10);
  local_108._48_8_ = *(undefined8 *)(__addr + 3);
  local_108._16_4_ = uVar2 | 0x40;
  SVar1 = this_02->kind;
  if ((int)SVar1 < 0xe4) {
    if ((int)SVar1 < 0x89) {
      if (SVar1 == ConditionalConstraint) {
        syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ConditionalConstraintSyntax>
                              (this_02);
        pCVar3 = ConditionalConstraint::fromSyntax(syntax_01,(ASTContext *)local_108);
      }
      else {
        if (SVar1 != ConstraintBlock) {
LAB_0023c955:
          this_01 = (logic_error *)
                    __cxa_allocate_exception(0x10,__addr,CONCAT44(in_register_00000014,__len));
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Constraints.cpp"
                     ,"");
          plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
          local_d0._M_dataplus._M_p = (pointer)*plVar4;
          psVar5 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
            local_d0.field_2._M_allocated_capacity = *psVar5;
            local_d0.field_2._8_8_ = plVar4[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar5;
          }
          local_d0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::to_string(&local_70,0x39);
          std::operator+(&local_50,&local_d0,&local_70);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_b0 = (Info *)*plVar4;
          pIVar6 = (Info *)(plVar4 + 2);
          if (local_b0 == pIVar6) {
            local_a0.rawTextPtr = pIVar6->rawTextPtr;
            local_a0.location = *(SourceLocation *)(plVar4 + 3);
            local_b0 = &local_a0;
          }
          else {
            local_a0.rawTextPtr = pIVar6->rawTextPtr;
          }
          local_a8 = plVar4[1];
          *plVar4 = (long)pIVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_128 = (long *)*plVar4;
          plVar7 = plVar4 + 2;
          if (local_128 == plVar7) {
            local_118 = *plVar7;
            lStack_110 = plVar4[3];
            local_128 = &local_118;
          }
          else {
            local_118 = *plVar7;
          }
          local_120 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::logic_error::logic_error(this_01,(string *)&local_128);
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        this = slang::syntax::SyntaxNode::as<slang::syntax::ConstraintBlockSyntax>(this_02);
        pCVar3 = ConstraintList::fromSyntax
                           ((ConstraintList *)this,(ConstraintBlockSyntax *)local_108,context);
      }
    }
    else if (SVar1 == DisableConstraint) {
      syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::DisableConstraintSyntax>(this_02);
      pCVar3 = DisableSoftConstraint::fromSyntax(syntax_03,(ASTContext *)local_108);
    }
    else {
      if (SVar1 != ExpressionConstraint) goto LAB_0023c955;
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionConstraintSyntax>(this_02);
      pCVar3 = ExpressionConstraint::fromSyntax(syntax_00,(ASTContext *)local_108);
    }
  }
  else if ((int)SVar1 < 0x19d) {
    if (SVar1 == ImplicationConstraint) {
      syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicationConstraintSyntax>(this_02)
      ;
      pCVar3 = ImplicationConstraint::fromSyntax(syntax_02,(ASTContext *)local_108);
    }
    else {
      if (SVar1 != LoopConstraint) goto LAB_0023c955;
      syntax = slang::syntax::SyntaxNode::as<slang::syntax::LoopConstraintSyntax>(this_02);
      pCVar3 = ForeachConstraint::fromSyntax(syntax,(ASTContext *)local_108);
    }
  }
  else if (SVar1 == SolveBeforeConstraint) {
    syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::SolveBeforeConstraintSyntax>(this_02);
    pCVar3 = SolveBeforeConstraint::fromSyntax(syntax_04,(ASTContext *)local_108);
  }
  else {
    if (SVar1 != UniquenessConstraint) goto LAB_0023c955;
    this_00 = slang::syntax::SyntaxNode::as<slang::syntax::UniquenessConstraintSyntax>(this_02);
    pCVar3 = UniquenessConstraint::fromSyntax
                       ((UniquenessConstraint *)this_00,(UniquenessConstraintSyntax *)local_108,
                        context_00);
  }
  pCVar3->syntax = (ConstraintItemSyntax *)this_02;
  return (int)pCVar3;
}

Assistant:

const Constraint& Constraint::bind(const ConstraintItemSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    Constraint* result;
    switch (syntax.kind) {
        case SyntaxKind::ConstraintBlock:
            result = &ConstraintList::fromSyntax(syntax.as<ConstraintBlockSyntax>(), ctx);
            break;
        case SyntaxKind::ExpressionConstraint:
            result = &ExpressionConstraint::fromSyntax(syntax.as<ExpressionConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::ImplicationConstraint:
            result = &ImplicationConstraint::fromSyntax(syntax.as<ImplicationConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::ConditionalConstraint:
            result = &ConditionalConstraint::fromSyntax(syntax.as<ConditionalConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::UniquenessConstraint:
            result = &UniquenessConstraint::fromSyntax(syntax.as<UniquenessConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::DisableConstraint:
            result = &DisableSoftConstraint::fromSyntax(syntax.as<DisableConstraintSyntax>(), ctx);
            break;
        case SyntaxKind::SolveBeforeConstraint:
            result = &SolveBeforeConstraint::fromSyntax(syntax.as<SolveBeforeConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::LoopConstraint:
            result = &ForeachConstraint::fromSyntax(syntax.as<LoopConstraintSyntax>(), ctx);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}